

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O2

int __thiscall
ot::commissioner::JoinerSession::RelaySocket::Send(RelaySocket *this,uint8_t *aBuf,size_t aLen)

{
  MessageSubType MVar1;
  char cVar2;
  JoinerSession *this_00;
  type atVar3 [2];
  uint uVar4;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  char *local_d0;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  code *local_b0;
  code *local_a8;
  writer write;
  Error error;
  string local_50;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  MVar1 = (this->super_Socket).mSubType;
  this_00 = this->mJoinerSession;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8,aBuf,aBuf + aLen,
             (allocator_type *)&local_50);
  SendRlyTx((Error *)local_d8,this_00,(ByteArray *)&local_f8,MVar1 == kJoinFinResponse);
  Error::operator=(&error,(Error *)local_d8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  if (error.mCode != kNone) {
    std::__cxx11::string::string((string *)&local_f8,"joiner-session",&local_f9);
    local_d8._0_4_ = pointer_type;
    local_d8._4_4_ = string_type;
    local_d0 = "session(={}) send RLY_TX.ntf failed: {}";
    local_c8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x27;
    aStack_c0._M_allocated_capacity = 0x200000000;
    local_b0 = ::fmt::v10::detail::
               parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    local_a8 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    from = "session(={}) send RLY_TX.ntf failed: {}";
    aStack_c0._8_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_d8;
    write.handler_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_d8;
    while (from != "") {
      cVar2 = *from;
      to = from;
      while (cVar2 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,from,"");
          goto LAB_00172c64;
        }
        cVar2 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string>&>
                       (to,"",(format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_d8);
    }
LAB_00172c64:
    atVar3 = (type  [2])this->mJoinerSession;
    Error::ToString_abi_cxx11_((string *)&write,&error);
    local_c8 = write.handler_;
    fmt.size_ = 0xde;
    fmt.data_ = (char *)0x27;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_d8;
    local_d8 = (undefined1  [8])atVar3;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_50,(v10 *)"session(={}) send RLY_TX.ntf failed: {}",fmt,args);
    Log(kError,&local_f8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&write);
    std::__cxx11::string::~string((string *)&local_f8);
    uVar4 = 0xffffffb2;
    if (error.mCode == kNone) {
      uVar4 = (uint)aLen;
    }
    aLen = (size_t)uVar4;
  }
  std::__cxx11::string::~string((string *)&error.mMessage);
  return (int)aLen;
}

Assistant:

int JoinerSession::RelaySocket::Send(const uint8_t *aBuf, size_t aLen)
{
    Error error;
    bool  includeKek = GetSubType() == MessageSubType::kJoinFinResponse;

    SuccessOrExit(error = mJoinerSession.SendRlyTx({aBuf, aBuf + aLen}, includeKek));

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_ERROR(LOG_REGION_JOINER_SESSION, "session(={}) send RLY_TX.ntf failed: {}",
                  static_cast<void *>(&mJoinerSession), error.ToString());
    }
    return error == ErrorCode::kNone ? static_cast<int>(aLen) : MBEDTLS_ERR_NET_SEND_FAILED;
}